

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O2

int publishTelemetryMsg(PMQTTTRANSPORT_HANDLE_DATA transport_data,
                       MQTT_MESSAGE_DETAILS_LIST *mqttMsgEntry,uchar *payload,size_t len,
                       _Bool isDuplicate)

{
  _Bool urlencode;
  uint16_t packetId;
  PMQTTTRANSPORT_HANDLE_DATA pMVar1;
  MQTT_MESSAGE_DETAILS_LIST *pMVar2;
  _Bool _Var3;
  MAP_RESULT MVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  STRING_HANDLE topic_string;
  MAP_HANDLE handle;
  STRING_HANDLE pSVar8;
  STRING_HANDLE pSVar9;
  char *pcVar10;
  LOGGER_LOG p_Var11;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *pIVar12;
  MQTT_MESSAGE_HANDLE handle_00;
  size_t index;
  char *pcVar13;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle;
  ulong local_70;
  PMQTTTRANSPORT_HANDLE_DATA local_68;
  MQTT_MESSAGE_DETAILS_LIST *local_60;
  char **propertyValues;
  uchar *local_50;
  size_t local_48;
  IOTHUB_MESSAGE_HANDLE local_40;
  char **propertyKeys;
  
  iotHubMessageHandle = mqttMsgEntry->iotHubMessageEntry->messageHandle;
  local_50 = payload;
  local_48 = len;
  pcVar7 = STRING_c_str(transport_data->topic_MqttEvent);
  urlencode = transport_data->auto_url_encode_decode;
  topic_string = STRING_construct(pcVar7);
  if (topic_string == (STRING_HANDLE)0x0) {
    p_Var11 = xlogging_get_log_function();
    if (p_Var11 != (LOGGER_LOG)0x0) {
      (*p_Var11)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"addPropertiesTouMqttMessage",0x3ed,1,"Failed to create event topic string handle"
                );
    }
    goto LAB_0012fa70;
  }
  handle = IoTHubMessage_Properties(iotHubMessageHandle);
  if (handle == (MAP_HANDLE)0x0) {
LAB_0012f774:
    index = 0;
    local_68 = transport_data;
    local_60 = mqttMsgEntry;
LAB_0012f784:
    _Var3 = IoTHubMessage_IsSecurityMessage(iotHubMessageHandle);
    pcVar7 = IoTHubMessage_GetCorrelationId(iotHubMessageHandle);
    if (pcVar7 == (char *)0x0) {
LAB_0012f7c3:
      pcVar7 = IoTHubMessage_GetMessageId(iotHubMessageHandle);
      if (pcVar7 != (char *)0x0) {
        iVar6 = addSystemPropertyToTopicString(topic_string,index,"mid",pcVar7,urlencode);
        if (iVar6 != 0) goto LAB_0012fa36;
        index = index + 1;
      }
      pcVar7 = IoTHubMessage_GetContentTypeSystemProperty(iotHubMessageHandle);
      if (pcVar7 != (char *)0x0) {
        iVar6 = addSystemPropertyToTopicString(topic_string,index,"ct",pcVar7,urlencode);
        if (iVar6 != 0) goto LAB_0012fa36;
        index = index + 1;
      }
      pcVar7 = IoTHubMessage_GetContentEncodingSystemProperty(iotHubMessageHandle);
      if (pcVar7 != (char *)0x0) {
        iVar6 = addSystemPropertyToTopicString
                          (topic_string,index,"ce",pcVar7,(_Bool)(urlencode | _Var3));
        if (iVar6 != 0) goto LAB_0012fa36;
        index = index + 1;
      }
      pcVar7 = IoTHubMessage_GetMessageCreationTimeUtcSystemProperty(iotHubMessageHandle);
      if (pcVar7 == (char *)0x0) {
        if (!_Var3) {
LAB_0012f974:
          pcVar7 = IoTHubMessage_GetOutputName(iotHubMessageHandle);
          if (pcVar7 != (char *)0x0) {
            iVar6 = addSystemPropertyToTopicString(topic_string,index,"on",pcVar7,urlencode);
            if (iVar6 != 0) {
              p_Var11 = xlogging_get_log_function();
              if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_0012fa36;
              pcVar7 = "Failed setting output name";
              iVar6 = 0x37c;
              goto LAB_0012fa31;
            }
            index = index + 1;
          }
          pcVar7 = IoTHubMessage_GetComponentName(iotHubMessageHandle);
          if (pcVar7 != (char *)0x0) {
            iVar6 = addSystemPropertyToTopicString(topic_string,index,"sub",pcVar7,urlencode);
            if (iVar6 != 0) {
              p_Var11 = xlogging_get_log_function();
              if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_0012fa36;
              pcVar7 = "Failed setting component name";
              iVar6 = 0x38e;
              goto LAB_0012fa31;
            }
            index = index + 1;
          }
          pIVar12 = IoTHubMessage_GetDiagnosticPropertyData(iotHubMessageHandle);
          if (pIVar12 != (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
            pcVar7 = pIVar12->diagnosticCreationTimeUtc;
            if (pcVar7 == (char *)0x0 || pIVar12->diagnosticId == (char *)0x0) {
              if (pIVar12->diagnosticId == (char *)0x0 && pcVar7 == (char *)0x0) goto LAB_0012fcfa;
              p_Var11 = xlogging_get_log_function();
              if (p_Var11 != (LOGGER_LOG)0x0) {
                pcVar7 = "diagid and diagcreationtimeutc must be present simultaneously.";
                iVar6 = 0x3da;
                goto LAB_0012fcab;
              }
            }
            else {
              pcVar13 = "&";
              pcVar10 = "&";
              if (index == 0) {
                pcVar10 = "";
              }
              iVar6 = STRING_sprintf(topic_string,"%s%%24.%s=%s",pcVar10,"diagid");
              if (iVar6 == 0) {
                pSVar8 = STRING_construct_sprintf("%s=%s","creationtimeutc",pcVar7);
                if (pSVar8 == (STRING_HANDLE)0x0) {
                  p_Var11 = xlogging_get_log_function();
                  if (p_Var11 != (LOGGER_LOG)0x0) {
                    pcVar7 = "Failed constructing diagnostic context";
                    iVar6 = 0x3ba;
                    goto LAB_0012fcab;
                  }
                }
                else {
                  pSVar9 = URL_Encode(pSVar8);
                  if ((pSVar9 == (STRING_HANDLE)0x0) ||
                     (pcVar7 = STRING_c_str(pSVar9), pcVar7 == (char *)0x0)) {
                    p_Var11 = xlogging_get_log_function();
                    if (p_Var11 != (LOGGER_LOG)0x0) {
                      (*p_Var11)(AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                 ,"addDiagnosticPropertiesTouMqttMessage",0x3cf,1,
                                 "Failed encoding diagnostic context value");
                    }
                  }
                  else {
                    if (index == 0xffffffffffffffff) {
                      pcVar13 = "";
                    }
                    iVar6 = STRING_sprintf(topic_string,"%s%%24.%s=%s",pcVar13,"diagctx",pcVar7);
                    if (iVar6 == 0) {
                      STRING_delete(pSVar9);
                      STRING_delete(pSVar8);
                      goto LAB_0012fcfa;
                    }
                    p_Var11 = xlogging_get_log_function();
                    if (p_Var11 != (LOGGER_LOG)0x0) {
                      (*p_Var11)(AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                 ,"addDiagnosticPropertiesTouMqttMessage",0x3c7,1,
                                 "Failed setting diagnostic context");
                    }
                    STRING_delete(pSVar9);
                  }
                  STRING_delete(pSVar8);
                }
              }
              else {
                p_Var11 = xlogging_get_log_function();
                if (p_Var11 != (LOGGER_LOG)0x0) {
                  pcVar7 = "Failed setting diagnostic id";
                  iVar6 = 0x3af;
LAB_0012fcab:
                  (*p_Var11)(AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                             ,"addDiagnosticPropertiesTouMqttMessage",iVar6,1,pcVar7);
                }
              }
            }
            p_Var11 = xlogging_get_log_function();
            if (p_Var11 != (LOGGER_LOG)0x0) {
              (*p_Var11)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"addPropertiesTouMqttMessage",0x3fd,1,
                         "Failed adding Diagnostic Properties to uMQTT Message");
            }
            goto LAB_0012fa6b;
          }
LAB_0012fcfa:
          pMVar2 = local_60;
          packetId = local_60->packet_id;
          pcVar7 = STRING_c_str(topic_string);
          handle_00 = mqttmessage_create_in_place
                                (packetId,pcVar7,DELIVER_AT_LEAST_ONCE,local_50,local_48);
          if (handle_00 == (MQTT_MESSAGE_HANDLE)0x0) {
            p_Var11 = xlogging_get_log_function();
            iVar6 = 0x417;
            if (p_Var11 != (LOGGER_LOG)0x0) {
              (*p_Var11)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"publishTelemetryMsg",0x416,1,"Failed creating mqtt message");
            }
            goto LAB_0012fe56;
          }
          iVar6 = mqttmessage_setIsDuplicateMsg(handle_00,isDuplicate);
          pMVar1 = local_68;
          if (iVar6 == 0) {
            iVar6 = tickcounter_get_current_ms(local_68->msgTickCounter,&pMVar2->msgPublishTime);
            if (iVar6 == 0) {
              iVar6 = mqtt_client_publish(pMVar1->mqttClient,handle_00);
              if (iVar6 == 0) {
                iVar6 = 0;
              }
              else {
                p_Var11 = xlogging_get_log_function();
                iVar6 = 0x42a;
                if (p_Var11 != (LOGGER_LOG)0x0) {
                  pcVar7 = "Failed attempting to publish mqtt message";
                  iVar5 = 0x429;
                  goto LAB_0012fe49;
                }
              }
            }
            else {
              p_Var11 = xlogging_get_log_function();
              iVar6 = 0x423;
              if (p_Var11 != (LOGGER_LOG)0x0) {
                pcVar7 = "Failed retrieving tickcounter info";
                iVar5 = 0x422;
                goto LAB_0012fe49;
              }
            }
          }
          else {
            p_Var11 = xlogging_get_log_function();
            iVar6 = 0x41e;
            if (p_Var11 != (LOGGER_LOG)0x0) {
              pcVar7 = "Failed setting DUP flag";
              iVar5 = 0x41d;
LAB_0012fe49:
              (*p_Var11)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"publishTelemetryMsg",iVar5,1,pcVar7);
            }
          }
          mqttmessage_destroy(handle_00);
LAB_0012fe56:
          STRING_delete(topic_string);
          return iVar6;
        }
LAB_0012f91a:
        iVar6 = addSystemPropertyToTopicString
                          (topic_string,index,"ifid","urn:azureiot:Security:SecurityAgent:1",true);
        if (iVar6 == 0) {
          index = index + 1;
          goto LAB_0012f974;
        }
        p_Var11 = xlogging_get_log_function();
        if (p_Var11 == (LOGGER_LOG)0x0) goto LAB_0012fa36;
        pcVar7 = "Failed setting Security interface id";
        iVar6 = 0x36a;
LAB_0012fa31:
        (*p_Var11)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"addSystemPropertiesTouMqttMessage",iVar6,1,pcVar7);
      }
      else {
        iVar6 = addSystemPropertyToTopicString(topic_string,index,"ctime",pcVar7,urlencode);
        index = index + 1;
        if (iVar6 == 0 && _Var3) goto LAB_0012f91a;
        if (iVar6 == 0) goto LAB_0012f974;
      }
    }
    else {
      iVar6 = addSystemPropertyToTopicString(topic_string,index,"cid",pcVar7,urlencode);
      if (iVar6 == 0) {
        index = index + 1;
        goto LAB_0012f7c3;
      }
    }
LAB_0012fa36:
    p_Var11 = xlogging_get_log_function();
    if (p_Var11 != (LOGGER_LOG)0x0) {
      pcVar7 = "Failed adding System Properties to uMQTT Message";
      iVar6 = 0x3f7;
LAB_0012fa63:
      (*p_Var11)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"addPropertiesTouMqttMessage",iVar6,1,pcVar7);
    }
  }
  else {
    MVar4 = Map_GetInternals(handle,&propertyKeys,&propertyValues,&local_70);
    if (MVar4 == MAP_OK) {
      if (local_70 == 0) goto LAB_0012f774;
      index = 0;
      iVar6 = 0;
      local_68 = transport_data;
      local_60 = mqttMsgEntry;
      local_40 = iotHubMessageHandle;
      while ((index < local_70 && (iVar6 == 0))) {
        if (urlencode == false) {
          pcVar7 = "&";
          if (index == local_70 - 1) {
            pcVar7 = "";
          }
          iVar6 = 0;
          iVar5 = STRING_sprintf(topic_string,"%s=%s%s",propertyKeys[index],propertyValues[index],
                                 pcVar7);
          if (iVar5 != 0) {
            p_Var11 = xlogging_get_log_function();
            iVar6 = 0x2dd;
            if (p_Var11 != (LOGGER_LOG)0x0) {
              (*p_Var11)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"addUserPropertiesTouMqttMessage",0x2dc,1,
                         "Failed constructing property string.");
            }
          }
        }
        else {
          pSVar8 = URL_EncodeString(propertyKeys[index]);
          pSVar9 = URL_EncodeString(propertyValues[index]);
          if ((pSVar8 == (STRING_HANDLE)0x0) || (pSVar9 == (STRING_HANDLE)0x0)) {
            p_Var11 = xlogging_get_log_function();
            iVar6 = 0x2ce;
            if (p_Var11 != (LOGGER_LOG)0x0) {
              iVar5 = 0x2cd;
              pcVar7 = "Failed URL Encoding properties";
LAB_0012f712:
              (*p_Var11)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"addUserPropertiesTouMqttMessage",iVar5,1,pcVar7);
            }
          }
          else {
            pcVar7 = STRING_c_str(pSVar8);
            pcVar10 = STRING_c_str(pSVar9);
            iotHubMessageHandle = local_40;
            pcVar13 = "&";
            if (index == local_70 - 1) {
              pcVar13 = "";
            }
            iVar6 = 0;
            iVar5 = STRING_sprintf(topic_string,"%s=%s%s",pcVar7,pcVar10,pcVar13);
            if (iVar5 != 0) {
              p_Var11 = xlogging_get_log_function();
              iVar6 = 0x2d3;
              if (p_Var11 != (LOGGER_LOG)0x0) {
                iVar5 = 0x2d2;
                pcVar7 = "Failed constructing property string.";
                goto LAB_0012f712;
              }
            }
          }
          STRING_delete(pSVar8);
          STRING_delete(pSVar9);
        }
        index = index + 1;
      }
      if (iVar6 != 0) goto LAB_0012f8df;
      goto LAB_0012f784;
    }
    p_Var11 = xlogging_get_log_function();
    if (p_Var11 != (LOGGER_LOG)0x0) {
      (*p_Var11)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"addUserPropertiesTouMqttMessage",0x2be,1,
                 "Failed to get the internals of the property map.");
    }
LAB_0012f8df:
    p_Var11 = xlogging_get_log_function();
    if (p_Var11 != (LOGGER_LOG)0x0) {
      pcVar7 = "Failed adding Properties to uMQTT Message";
      iVar6 = 0x3f1;
      goto LAB_0012fa63;
    }
  }
LAB_0012fa6b:
  STRING_delete(topic_string);
LAB_0012fa70:
  p_Var11 = xlogging_get_log_function();
  if (p_Var11 != (LOGGER_LOG)0x0) {
    (*p_Var11)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
               ,"publishTelemetryMsg",0x40e,1,"Failed adding properties to mqtt message");
  }
  return 0x40f;
}

Assistant:

static int publishTelemetryMsg(PMQTTTRANSPORT_HANDLE_DATA transport_data, MQTT_MESSAGE_DETAILS_LIST* mqttMsgEntry, const unsigned char* payload, size_t len, bool isDuplicate)
{
    int result;
    STRING_HANDLE msgTopic = addPropertiesTouMqttMessage(mqttMsgEntry->iotHubMessageEntry->messageHandle, STRING_c_str(transport_data->topic_MqttEvent), transport_data->auto_url_encode_decode);
    if (msgTopic == NULL)
    {
        LogError("Failed adding properties to mqtt message");
        result = MU_FAILURE;
    }
    else
    {
        MQTT_MESSAGE_HANDLE mqttMsg = mqttmessage_create_in_place(mqttMsgEntry->packet_id, STRING_c_str(msgTopic), DELIVER_AT_LEAST_ONCE, payload, len);
        if (mqttMsg == NULL)
        {
            LogError("Failed creating mqtt message");
            result = MU_FAILURE;
        }
        else
        {
            if (mqttmessage_setIsDuplicateMsg(mqttMsg, isDuplicate) != 0)
            {
                LogError("Failed setting DUP flag");
                result = MU_FAILURE;
            }
            else if (tickcounter_get_current_ms(transport_data->msgTickCounter, &mqttMsgEntry->msgPublishTime) != 0)
            {
                LogError("Failed retrieving tickcounter info");
                result = MU_FAILURE;
            }
            else
            {
                if (mqtt_client_publish(transport_data->mqttClient, mqttMsg) != 0)
                {
                    LogError("Failed attempting to publish mqtt message");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
            mqttmessage_destroy(mqttMsg);
        }
        STRING_delete(msgTopic);
    }
    return result;
}